

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_reducer.cpp
# Opt level: O0

void report_clusters(StringBuffer *defined_clusters,Vector *cluster_lengths,Vector *cluster_sizes,
                    long firstSequenceLength,long minimum_cluster_size,bool json,char sep,FILE *out)

{
  byte bVar1;
  uint uVar2;
  unsigned_long uVar3;
  long lVar4;
  StringBuffer *pSVar5;
  Vector *in_RDX;
  long in_R8;
  byte in_R9B;
  char in_stack_00000008;
  FILE *in_stack_00000010;
  unsigned_long k_1;
  unsigned_long k;
  bool do_comma;
  unsigned_long in_stack_ffffffffffffff98;
  StringBuffer *index;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  StringBuffer *in_stack_ffffffffffffffa8;
  FILE *in_stack_ffffffffffffffb0;
  FILE *pFVar6;
  long in_stack_ffffffffffffffb8;
  ulong firstSequenceLength_00;
  char *in_stack_ffffffffffffffc0;
  StringBuffer *strings;
  ulong local_38;
  undefined6 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd6;
  byte bVar7;
  undefined1 uVar8;
  
  bVar1 = in_R9B & 1;
  if (bVar1 == 0) {
    strings = (StringBuffer *)0x0;
    uVar8 = 0;
    while (index = strings, pSVar5 = (StringBuffer *)Vector::length(in_RDX), strings < pSVar5) {
      lVar4 = Vector::value(in_RDX,(long)index);
      pFVar6 = in_stack_00000010;
      pSVar5 = index;
      if (in_R8 <= lVar4) {
        uVar2 = (uint)in_stack_00000008;
        lVar4 = Vector::value(in_RDX,(long)index);
        fprintf(pFVar6,">cluster_%ld%c%ld\n",index,(ulong)uVar2,lVar4);
        stringText(strings,(Vector *)CONCAT44(uVar2,in_stack_ffffffffffffffa0),(unsigned_long)index)
        ;
        dump_fasta((char *)pSVar5,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                   SUB81((ulong)strings >> 0x38,0),SUB81((ulong)strings >> 0x30,0),
                   CONCAT44(uVar2,in_stack_ffffffffffffffa0),
                   CONCAT17(uVar8,CONCAT16(in_stack_ffffffffffffffd6,in_stack_ffffffffffffffd0)));
      }
      strings = (StringBuffer *)((long)&pSVar5->sData + 1);
    }
  }
  else {
    bVar7 = 0;
    fprintf(in_stack_00000010,"\n{");
    local_38 = 0;
    while (firstSequenceLength_00 = local_38, uVar3 = Vector::length(in_RDX),
          firstSequenceLength_00 < uVar3) {
      lVar4 = Vector::value(in_RDX,local_38);
      if (in_R8 <= lVar4) {
        if ((bVar7 & 1) == 0) {
          fprintf(in_stack_00000010,"\n");
        }
        else {
          fprintf(in_stack_00000010,",\n");
        }
        pFVar6 = in_stack_00000010;
        lVar4 = Vector::value(in_RDX,local_38);
        fprintf(pFVar6,"{\"read_count\":%ld, \"sequence\":\"",lVar4);
        stringText(in_stack_ffffffffffffffa8,
                   (Vector *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                   in_stack_ffffffffffffff98);
        dump_fasta(in_stack_ffffffffffffffc0,firstSequenceLength_00,(FILE *)pFVar6,
                   SUB81((ulong)in_stack_ffffffffffffffa8 >> 0x38,0),
                   SUB81((ulong)in_stack_ffffffffffffffa8 >> 0x30,0),
                   CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                   CONCAT17(bVar1,CONCAT16(bVar7,in_stack_ffffffffffffffd0)));
        fprintf(in_stack_00000010,"\"}");
        bVar7 = 1;
      }
      local_38 = local_38 + 1;
    }
    fprintf(in_stack_00000010,"\n}\n");
  }
  return;
}

Assistant:

void report_clusters (StringBuffer& defined_clusters, Vector& cluster_lengths, Vector& cluster_sizes, const long firstSequenceLength, const long minimum_cluster_size, bool json, char sep, FILE * out) {
    if (json) {
        bool do_comma = false;
        fprintf (out, "\n{");
        for (unsigned long k = 0; k < cluster_sizes.length(); k++) {
            if (cluster_sizes.value(k) >= minimum_cluster_size) {
                if (do_comma) {
                    fprintf (out, ",\n");
                } else {
                    fprintf (out, "\n");                
                }
                fprintf (out,"{\"read_count\":%ld, \"sequence\":\"", cluster_sizes.value(k));
                dump_fasta(stringText(defined_clusters, cluster_lengths, k), firstSequenceLength, out, false);
                fprintf (out,"\"}");
                do_comma = true;
            }
        } 
        fprintf (out, "\n}\n");    
    } else {
        for (unsigned long k = 0; k < cluster_sizes.length(); k++) {
            if (cluster_sizes.value(k) >= minimum_cluster_size) {
                fprintf (out, ">cluster_%ld%c%ld\n", k, sep, cluster_sizes.value(k));
                dump_fasta(stringText(defined_clusters, cluster_lengths, k), firstSequenceLength, out);
            }
        }
    }
}